

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O0

int __thiscall
vk::DescriptorSetUpdateBuilder::copy
          (DescriptorSetUpdateBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 local_68 [8];
  VkCopyDescriptorSet copyParams;
  deUint32 destBinding_local;
  deUint32 srcArrayElement_local;
  deUint32 srcBinding_local;
  DescriptorSetUpdateBuilder *this_local;
  VkDescriptorSet destSet_local;
  VkDescriptorSet srcSet_local;
  
  copyParams.srcSet.m_internal._0_4_ = SUB84(src,0);
  local_68._0_4_ = VK_STRUCTURE_TYPE_COPY_DESCRIPTOR_SET;
  copyParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copyParams._4_4_ = 0;
  copyParams.pNext = dst;
  std::vector<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>::push_back
            (&this->m_copies,(value_type *)local_68);
  return (int)this;
}

Assistant:

DescriptorSetUpdateBuilder& DescriptorSetUpdateBuilder::copy (VkDescriptorSet	srcSet,
															  deUint32			srcBinding,
															  deUint32			srcArrayElement,
															  VkDescriptorSet	destSet,
															  deUint32			destBinding,
															  deUint32			destArrayElement,
															  deUint32			count)
{
	const VkCopyDescriptorSet copyParams =
	{
		VK_STRUCTURE_TYPE_COPY_DESCRIPTOR_SET,
		DE_NULL,
		srcSet,				//!< srcSet
		srcBinding,			//!< srcBinding
		srcArrayElement,	//!< srcArrayElement
		destSet,			//!< destSet
		destBinding,		//!< destBinding
		destArrayElement,	//!< destArrayElement
		count,				//!< count
	};
	m_copies.push_back(copyParams);
	return *this;
}